

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::unroll_array_to_complex_store
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *var_00;
  SPIRType *pSVar4;
  bool *pbVar5;
  uint *puVar6;
  CompilerError *this_00;
  undefined1 local_2a0 [64];
  undefined1 local_260 [32];
  undefined1 local_240 [40];
  SPIRType target_type;
  allocator local_a9;
  string local_a8 [48];
  spirv_cross local_78 [32];
  string local_58 [8];
  string array_expr;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t source_id_local;
  uint32_t target_id_local;
  CompilerGLSL *this_local;
  
  if (((this->backend).force_gl_in_out_block & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    var_00 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,target_id);
    if ((var_00 == (SPIRVariable *)0x0) || (var_00->storage != StorageClassOutput)) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = Compiler::is_builtin_variable(&this->super_Compiler,var_00);
      if ((bVar2) &&
         (uVar3 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,
                             DecorationBuiltIn), uVar3 == 0x14)) {
        pSVar4 = Compiler::expression_type(&this->super_Compiler,source_id);
        ::std::__cxx11::string::string(local_58);
        pbVar5 = VectorView<bool>::back(&(pSVar4->array_size_literal).super_VectorView<bool>);
        uVar3 = (uint32_t)this;
        if ((*pbVar5 & 1U) == 0) {
          puVar6 = VectorView<unsigned_int>::back(&(pSVar4->array).super_VectorView<unsigned_int>);
          to_expression_abi_cxx11_
                    ((CompilerGLSL *)&target_type.member_name_cache._M_h._M_single_bucket,uVar3,
                     SUB41(*puVar6,0));
          ::std::__cxx11::string::operator=
                    (local_58,(string *)&target_type.member_name_cache._M_h._M_single_bucket);
          ::std::__cxx11::string::~string
                    ((string *)&target_type.member_name_cache._M_h._M_single_bucket);
        }
        else {
          puVar6 = VectorView<unsigned_int>::back(&(pSVar4->array).super_VectorView<unsigned_int>);
          convert_to_string<unsigned_int,_0>(local_78,puVar6);
          ::std::__cxx11::string::operator=(local_58,(string *)local_78);
          ::std::__cxx11::string::~string((string *)local_78);
          puVar6 = VectorView<unsigned_int>::back(&(pSVar4->array).super_VectorView<unsigned_int>);
          if (*puVar6 == 0) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_a8,"Cannot unroll an array copy from unsized array.",&local_a9);
            CompilerError::CompilerError(this_00,(string *)local_a8);
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
        SPIRType::SPIRType((SPIRType *)(local_240 + 0x20));
        target_type.super_IVariant._vptr_IVariant._4_4_ = 7;
        statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                  (this,(char (*) [25])"for (int i = 0; i < int(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   (char (*) [8])"); i++)");
        begin_scope(this);
        to_expression_abi_cxx11_((CompilerGLSL *)local_240,uVar3,SUB41(target_id,0));
        uVar1 = *(uint *)&(pSVar4->super_IVariant).field_0xc;
        to_expression_abi_cxx11_((CompilerGLSL *)local_2a0,uVar3,SUB41(source_id,0));
        join<std::__cxx11::string,char_const(&)[4]>
                  ((spirv_cross *)(local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   (char (*) [4])"[i]");
        bitcast_expression((CompilerGLSL *)local_260,(SPIRType *)this,(int)local_240 + 0x20,
                           (string *)(ulong)uVar1);
        statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_240,(char (*) [7])"[i] = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   (char (*) [2])0x5b3b6f);
        ::std::__cxx11::string::~string((string *)local_260);
        ::std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
        ::std::__cxx11::string::~string((string *)local_2a0);
        ::std::__cxx11::string::~string((string *)local_240);
        end_scope(this);
        this_local._7_1_ = true;
        SPIRType::~SPIRType((SPIRType *)(local_240 + 0x20));
        ::std::__cxx11::string::~string(local_58);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::unroll_array_to_complex_store(uint32_t target_id, uint32_t source_id)
{
	if (!backend.force_gl_in_out_block)
		return false;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(target_id);
	if (!var || var->storage != StorageClassOutput)
		return false;

	if (!is_builtin_variable(*var) || BuiltIn(get_decoration(var->self, DecorationBuiltIn)) != BuiltInSampleMask)
		return false;

	auto &type = expression_type(source_id);
	string array_expr;
	if (type.array_size_literal.back())
	{
		array_expr = convert_to_string(type.array.back());
		if (type.array.back() == 0)
			SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
	}
	else
		array_expr = to_expression(type.array.back());

	SPIRType target_type;
	target_type.basetype = SPIRType::Int;

	statement("for (int i = 0; i < int(", array_expr, "); i++)");
	begin_scope();
	statement(to_expression(target_id), "[i] = ",
	          bitcast_expression(target_type, type.basetype, join(to_expression(source_id), "[i]")),
	          ";");
	end_scope();

	return true;
}